

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool __thiscall kratos::PackedStruct::same(PackedStruct *this,PackedStruct *def)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  pPVar1 = (this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pPVar2 - (long)pPVar1;
  pPVar3 = (def->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 == (long)(def->attributes).
                     super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) {
    if (pPVar2 == pPVar1) {
      bVar4 = true;
    }
    else {
      uVar8 = (lVar5 >> 4) * -0x5555555555555555;
      uVar6 = 0;
      uVar7 = 1;
      do {
        bVar4 = PackedStructFieldDef::same(pPVar1 + uVar6,pPVar3 + uVar6);
        if (!bVar4) {
          return bVar4;
        }
        bVar9 = uVar7 <= uVar8;
        lVar5 = uVar8 - uVar7;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar9 && lVar5 != 0);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool PackedStruct::same(const PackedStruct &def) const {
    if (attributes.size() != def.attributes.size()) return false;
    for (auto i = 0u; i < attributes.size(); i++) {
        if (!attributes[i].same(def.attributes[i])) return false;
    }
    return true;
}